

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s_unittest.cpp
# Opt level: O0

void __thiscall
SortMapSUnitTest_initializer_construct_Test::~SortMapSUnitTest_initializer_construct_Test
          (SortMapSUnitTest_initializer_construct_Test *this)

{
  SortMapSUnitTest_initializer_construct_Test *this_local;
  
  ~SortMapSUnitTest_initializer_construct_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(SortMapSUnitTest, initializer_construct)
{
    using MyMap = estl::sort_map_s<std::string, std::string, 30>;

    MyMap m {
        {"key_010", "val_010"},
        {"key_020", "val_020"},
        {"key_030", "val_030"},
        {"key_040", "val_040"},
        {"key_050", "val_050"},
        {"key_060", "val_060"},
        {"key_070", "val_070"},
        {"key_080", "val_080"},
        {"key_000", "val_000"},
        {"key_100", "val_100"},
        {"key_110", "val_110"},
        {"key_090", "val_090"}
    };

    EXPECT_EQ(12u, m.size());
    EXPECT_EQ("val_010", m["key_010"]);
    EXPECT_EQ("val_020", m["key_020"]);
    EXPECT_EQ("val_030", m["key_030"]);
    EXPECT_EQ("val_040", m["key_040"]);
    EXPECT_EQ("val_050", m["key_050"]);
    EXPECT_EQ("val_060", m["key_060"]);
    EXPECT_EQ("val_070", m["key_070"]);
    EXPECT_EQ("val_080", m["key_080"]);
    EXPECT_EQ("val_000", m["key_000"]);
    EXPECT_EQ("val_100", m["key_100"]);
    EXPECT_EQ("val_110", m["key_110"]);
    EXPECT_EQ("val_090", m["key_090"]);
}